

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueEQ_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionValueEQ_Test *this)

{
  undefined4 *puVar1;
  int x;
  AssertionResult iutest_ar;
  AssertionResult ar;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 1;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

IUTEST(SyntaxTest, ExceptionValueEQ)
{
    if( int x = 1 )
        IUTEST_ASSERT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_THROW_VALUE_EQ(throw 1, int, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_THROW_VALUE_EQ(throw 1, int, x) << x;
}